

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

OptionStatus
checkOptions(HighsLogOptions *report_log_options,
            vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records)

{
  HighsOptionType HVar1;
  OptionRecordDouble *option;
  OptionRecord *pOVar2;
  _func_int **pp_Var3;
  OptionRecord *pOVar4;
  OptionRecordInt *option_00;
  __type _Var5;
  OptionStatus OVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  HighsInt check_index;
  ulong uVar10;
  ulong uVar11;
  string name;
  string check_name;
  
  uVar7 = (ulong)((long)(option_records->
                        super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl
                        .super__Vector_impl_data._M_finish -
                 (long)(option_records->
                       super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar8 = 0;
  if (0 < (int)uVar7) {
    uVar8 = uVar7 & 0xffffffff;
  }
  uVar7 = uVar7 & 0xffffffff;
  bVar9 = false;
  for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
    std::__cxx11::string::string
              ((string *)&name,
               (string *)
               &(option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar11]->name);
    HVar1 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
            _M_impl.super__Vector_impl_data._M_start[uVar11]->type;
    for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      if (uVar11 != uVar10) {
        std::__cxx11::string::string
                  ((string *)&check_name,
                   (string *)
                   &(option_records->
                    super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar10]->name);
        _Var5 = std::operator==(&check_name,&name);
        if (_Var5) {
          bVar9 = true;
          highsLogUser(report_log_options,kError,
                       "checkOptions: Option %d (\"%s\") has the same name as option %d \"%s\"\n",
                       uVar11 & 0xffffffff,name._M_dataplus._M_p,uVar10 & 0xffffffff,
                       check_name._M_dataplus._M_p);
        }
        std::__cxx11::string::~string((string *)&check_name);
      }
    }
    switch(HVar1) {
    case kBool:
      pOVar2 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)
               ._M_impl.super__Vector_impl_data._M_start[uVar11];
      pp_Var3 = pOVar2[1]._vptr_OptionRecord;
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        if (((uVar11 != uVar10) &&
            (pOVar4 = (option_records->
                      super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar10], pOVar4->type == kBool)) &&
           (pOVar4[1]._vptr_OptionRecord == pp_Var3)) {
          bVar9 = true;
          highsLogUser(report_log_options,kError,
                       "checkOptions: Option %d (\"%s\") has the same value pointer as option %d (\"%s\")\n"
                       ,uVar11 & 0xffffffff,(pOVar2->name)._M_dataplus._M_p,uVar10 & 0xffffffff,
                       (pOVar4->name)._M_dataplus._M_p);
        }
      }
      break;
    case kInt:
      option_00 = (OptionRecordInt *)
                  (option_records->
                  super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar11];
      OVar6 = checkOption(report_log_options,option_00);
      bVar9 = (bool)(bVar9 | OVar6 != kOk);
      pp_Var3 = (_func_int **)option_00->value;
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        if (((uVar11 != uVar10) &&
            (pOVar2 = (option_records->
                      super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar10], pOVar2->type == kInt)) &&
           (pOVar2[1]._vptr_OptionRecord == pp_Var3)) {
          bVar9 = true;
          highsLogUser(report_log_options,kError,
                       "checkOptions: Option %d (\"%s\") has the same value pointer as option %d (\"%s\")\n"
                       ,uVar11 & 0xffffffff,(option_00->super_OptionRecord).name._M_dataplus._M_p,
                       uVar10 & 0xffffffff,(pOVar2->name)._M_dataplus._M_p);
        }
      }
      break;
    case kDouble:
      option = (OptionRecordDouble *)
               (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)
               ._M_impl.super__Vector_impl_data._M_start[uVar11];
      OVar6 = checkOption(report_log_options,option);
      bVar9 = (bool)(bVar9 | OVar6 != kOk);
      pp_Var3 = (_func_int **)option->value;
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        if (((uVar11 != uVar10) &&
            (pOVar2 = (option_records->
                      super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar10], pOVar2->type == kDouble)) &&
           (pOVar2[1]._vptr_OptionRecord == pp_Var3)) {
          bVar9 = true;
          highsLogUser(report_log_options,kError,
                       "checkOptions: Option %d (\"%s\") has the same value pointer as option %d (\"%s\")\n"
                       ,uVar11 & 0xffffffff,(option->super_OptionRecord).name._M_dataplus._M_p,
                       uVar10 & 0xffffffff,(pOVar2->name)._M_dataplus._M_p);
        }
      }
      break;
    case kString:
      pOVar2 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)
               ._M_impl.super__Vector_impl_data._M_start[uVar11];
      pp_Var3 = pOVar2[1]._vptr_OptionRecord;
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        if (((uVar11 != uVar10) &&
            (pOVar4 = (option_records->
                      super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar10], pOVar4->type == kString)) &&
           (pOVar4[1]._vptr_OptionRecord == pp_Var3)) {
          bVar9 = true;
          highsLogUser(report_log_options,kError,
                       "checkOptions: Option %d (\"%s\") has the same value pointer as option %d (\"%s\")\n"
                       ,uVar11 & 0xffffffff,(pOVar2->name)._M_dataplus._M_p,uVar10 & 0xffffffff,
                       (pOVar4->name)._M_dataplus._M_p);
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
  }
  if (bVar9) {
    OVar6 = kIllegalValue;
  }
  else {
    OVar6 = kOk;
    highsLogUser(report_log_options,kInfo,"checkOptions: Options are OK\n");
  }
  return OVar6;
}

Assistant:

OptionStatus checkOptions(const HighsLogOptions& report_log_options,
                          const std::vector<OptionRecord*>& option_records) {
  bool error_found = false;
  HighsInt num_options = option_records.size();
  for (HighsInt index = 0; index < num_options; index++) {
    std::string name = option_records[index]->name;
    HighsOptionType type = option_records[index]->type;
    // Check that there are no other options with the same name
    for (HighsInt check_index = 0; check_index < num_options; check_index++) {
      if (check_index == index) continue;
      std::string check_name = option_records[check_index]->name;
      if (check_name == name) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "checkOptions: Option %" HIGHSINT_FORMAT
                     " (\"%s\") has the same name as "
                     "option %" HIGHSINT_FORMAT " \"%s\"\n",
                     index, name.c_str(), check_index, check_name.c_str());
        error_found = true;
      }
    }
    if (type == HighsOptionType::kBool) {
      // Check bool option
      OptionRecordBool& option = ((OptionRecordBool*)option_records[index])[0];
      // Check that there are no other options with the same value pointers
      bool* value_pointer = option.value;
      for (HighsInt check_index = 0; check_index < num_options; check_index++) {
        if (check_index == index) continue;
        if (option_records[check_index]->type == HighsOptionType::kBool) {
          OptionRecordBool& check_option =
              ((OptionRecordBool*)option_records[check_index])[0];
          if (check_option.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkOptions: Option %" HIGHSINT_FORMAT
                         " (\"%s\") has the same "
                         "value pointer as option %" HIGHSINT_FORMAT
                         " (\"%s\")\n",
                         index, option.name.c_str(), check_index,
                         check_option.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsOptionType::kInt) {
      // Check HighsInt option
      OptionRecordInt& option = ((OptionRecordInt*)option_records[index])[0];
      if (checkOption(report_log_options, option) != OptionStatus::kOk)
        error_found = true;
      // Check that there are no other options with the same value pointers
      HighsInt* value_pointer = option.value;
      for (HighsInt check_index = 0; check_index < num_options; check_index++) {
        if (check_index == index) continue;
        if (option_records[check_index]->type == HighsOptionType::kInt) {
          OptionRecordInt& check_option =
              ((OptionRecordInt*)option_records[check_index])[0];
          if (check_option.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkOptions: Option %" HIGHSINT_FORMAT
                         " (\"%s\") has the same "
                         "value pointer as option %" HIGHSINT_FORMAT
                         " (\"%s\")\n",
                         index, option.name.c_str(), check_index,
                         check_option.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsOptionType::kDouble) {
      // Check double option
      OptionRecordDouble& option =
          ((OptionRecordDouble*)option_records[index])[0];
      if (checkOption(report_log_options, option) != OptionStatus::kOk)
        error_found = true;
      // Check that there are no other options with the same value pointers
      double* value_pointer = option.value;
      for (HighsInt check_index = 0; check_index < num_options; check_index++) {
        if (check_index == index) continue;
        if (option_records[check_index]->type == HighsOptionType::kDouble) {
          OptionRecordDouble& check_option =
              ((OptionRecordDouble*)option_records[check_index])[0];
          if (check_option.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkOptions: Option %" HIGHSINT_FORMAT
                         " (\"%s\") has the same "
                         "value pointer as option %" HIGHSINT_FORMAT
                         " (\"%s\")\n",
                         index, option.name.c_str(), check_index,
                         check_option.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsOptionType::kString) {
      // Check string option
      OptionRecordString& option =
          ((OptionRecordString*)option_records[index])[0];
      // Check that there are no other options with the same value pointers
      std::string* value_pointer = option.value;
      for (HighsInt check_index = 0; check_index < num_options; check_index++) {
        if (check_index == index) continue;
        if (option_records[check_index]->type == HighsOptionType::kString) {
          OptionRecordString& check_option =
              ((OptionRecordString*)option_records[check_index])[0];
          if (check_option.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkOptions: Option %" HIGHSINT_FORMAT
                         " (\"%s\") has the same "
                         "value pointer as option %" HIGHSINT_FORMAT
                         " (\"%s\")\n",
                         index, option.name.c_str(), check_index,
                         check_option.name.c_str());
            error_found = true;
          }
        }
      }
    }
  }
  if (error_found) return OptionStatus::kIllegalValue;
  highsLogUser(report_log_options, HighsLogType::kInfo,
               "checkOptions: Options are OK\n");
  return OptionStatus::kOk;
}